

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall
KDIS::NETWORK::Connection::RemoveSubscriber(Connection *this,ConnectionSubscriber *S)

{
  bool bVar1;
  reference ppCVar2;
  const_iterator local_38;
  ConnectionSubscriber **local_30;
  __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
  local_28;
  iterator itrEnd;
  iterator itr;
  ConnectionSubscriber *S_local;
  Connection *this_local;
  
  if (S != (ConnectionSubscriber *)0x0) {
    itrEnd = std::
             vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
             ::begin(&this->m_vpSubscribers);
    local_28._M_current =
         (ConnectionSubscriber **)
         std::
         vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
         ::end(&this->m_vpSubscribers);
    while (bVar1 = __gnu_cxx::operator!=(&itrEnd,&local_28), bVar1) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
                ::operator*(&itrEnd);
      if (*ppCVar2 == S) {
        __gnu_cxx::
        __normal_iterator<KDIS::NETWORK::ConnectionSubscriber*const*,std::vector<KDIS::NETWORK::ConnectionSubscriber*,std::allocator<KDIS::NETWORK::ConnectionSubscriber*>>>
        ::__normal_iterator<KDIS::NETWORK::ConnectionSubscriber**>
                  ((__normal_iterator<KDIS::NETWORK::ConnectionSubscriber*const*,std::vector<KDIS::NETWORK::ConnectionSubscriber*,std::allocator<KDIS::NETWORK::ConnectionSubscriber*>>>
                    *)&local_38,&itrEnd);
        local_30 = (ConnectionSubscriber **)
                   std::
                   vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                   ::erase(&this->m_vpSubscribers,local_38);
        itrEnd._M_current = local_30;
        local_28._M_current =
             (ConnectionSubscriber **)
             std::
             vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
             ::end(&this->m_vpSubscribers);
      }
      else {
        __gnu_cxx::
        __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
        ::operator++(&itrEnd);
      }
    }
  }
  return;
}

Assistant:

void Connection::RemoveSubscriber( ConnectionSubscriber * S )
{
    if( S )
    {
        // Perform a linear search for the subscriber.
        vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
        vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
        while( itr != itrEnd )
        {
            if( *itr == S )
            {
                // Remove the subsriber
                itr = m_vpSubscribers.erase( itr );
                itrEnd = m_vpSubscribers.end();

                // Now continue searching, the subscriber may have been added twice...
            }
            else
            {
                ++itr;
            }
        }
    }
}